

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fPrimitiveBoundingBoxTests.cpp
# Opt level: O3

int __thiscall
deqp::gles31::Functional::anon_unknown_1::ViewportCallOrderCase::init
          (ViewportCallOrderCase *this,EVP_PKEY_CTX *ctx)

{
  MovePtr<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  *this_00;
  MovePtr<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> *this_01;
  int *piVar1;
  ostringstream *this_02;
  undefined4 uVar2;
  Context *pCVar3;
  RenderContext *renderCtx;
  ShaderProgram *pSVar4;
  ulong uVar5;
  undefined1 auVar6 [16];
  undefined8 uVar7;
  ContextInfo *pCVar8;
  TestContext *pTVar9;
  bool bVar10;
  ContextType ctxType;
  int iVar11;
  deUint32 dVar12;
  undefined4 extraout_var;
  uint *__s;
  void *__s_00;
  long lVar13;
  ObjectWrapper *this_03;
  undefined4 extraout_var_00;
  ObjectTraits *traits;
  Context *pCVar14;
  ContextInfo *__dest;
  pointer __dest_00;
  TestLog *pTVar15;
  TestError *this_04;
  NotSupportedError *pNVar16;
  uint *puVar17;
  long lVar18;
  ulong uVar19;
  char *pcVar20;
  value_type_conflict1 *__val;
  int iVar21;
  int iVar22;
  int iVar23;
  uint uVar24;
  uint uVar26;
  uint uVar27;
  undefined1 auVar25 [16];
  uint uVar28;
  uint uVar29;
  float fVar30;
  uint uVar32;
  float fVar33;
  float fVar34;
  undefined1 auVar31 [16];
  float fVar35;
  int iVar36;
  int iVar37;
  int iVar38;
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  float fVar41;
  float fVar44;
  float fVar45;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  float fVar46;
  int iVar48;
  undefined1 auVar47 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  size_type __dnew;
  size_type __dnew_1;
  size_type __dnew_3;
  size_type __dnew_2;
  Random rnd;
  undefined1 local_370 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_360;
  undefined1 local_348 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_338;
  Context *local_320;
  TestContext *local_318;
  Context local_310;
  Context *local_2f8;
  TestContext *local_2f0;
  Context local_2e8;
  ContextInfo *local_2d0;
  undefined1 local_2c8 [48];
  ContextInfo *local_298;
  value_type local_290;
  TestContext *local_270;
  TestContext *local_268;
  value_type local_260;
  string local_240;
  string local_220;
  string local_200;
  string local_1e0;
  UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_> local_1c0;
  undefined1 local_1b0 [16];
  undefined1 local_1a0 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_180 [4];
  ios_base local_138 [24];
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_120;
  _Vector_impl_data local_100 [8];
  
  ctxType.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  bVar10 = glu::contextSupports(ctxType,(ApiType)0x23);
  if (!bVar10) {
    bVar10 = glu::ContextInfo::isExtensionSupported
                       (((this->super_TestCase).m_context)->m_contextInfo,
                        "GL_EXT_primitive_bounding_box");
    if (!bVar10) {
      pNVar16 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1b0._0_8_ = local_1b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"Test requires GL_EXT_primitive_bounding_box extension","");
      tcu::NotSupportedError::NotSupportedError(pNVar16,(string *)local_1b0);
      __cxa_throw(pNVar16,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    bVar10 = glu::ContextInfo::isExtensionSupported
                       (((this->super_TestCase).m_context)->m_contextInfo,
                        "GL_EXT_tessellation_shader");
    if (!bVar10) {
      pNVar16 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      local_1b0._0_8_ = local_1b0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_1b0,"Test requires GL_EXT_tessellation_shader extension","");
      tcu::NotSupportedError::NotSupportedError(pNVar16,(string *)local_1b0);
      __cxa_throw(pNVar16,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  local_1b0._0_8_ = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_02 = (ostringstream *)(local_1b0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_02);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_02,
             "Testing call order of state setting functions have no effect on the rendering.\n",0x4f
            );
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_02,"Setting viewport and bounding box in the following order:\n",0x3a);
  bVar10 = this->m_callOrder == VIEWPORT_FIRST;
  pcVar20 = "\tFirst bounding box with glPrimitiveBoundingBoxEXT function.\n";
  if (bVar10) {
    pcVar20 = "\tFirst viewport with glViewport function.\n";
  }
  lVar18 = 0x3d;
  if (bVar10) {
    lVar18 = 0x2a;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_02,pcVar20,lVar18);
  bVar10 = this->m_callOrder == VIEWPORT_FIRST;
  pcVar20 = "\tThen viewport with glViewport function.\n";
  if (bVar10) {
    pcVar20 = "\tThen bounding box with glPrimitiveBoundingBoxEXT function.\n";
  }
  lVar18 = 0x29;
  if (bVar10) {
    lVar18 = 0x3c;
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_02,pcVar20,lVar18);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)this_02,"Verifying rendering result.",0x1b);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_02);
  std::ios_base::~ios_base(local_138);
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar18 = CONCAT44(extraout_var,iVar11);
  __s = (uint *)operator_new(0xd80);
  memset(__s,0,0xd80);
  __s_00 = operator_new(0x120);
  memset(__s_00,0,0x120);
  deRandom_init((deRandom *)local_1b0,0x55443322);
  iVar11 = 0;
  iVar21 = 1;
  iVar22 = 2;
  iVar23 = 3;
  lVar13 = 0;
  do {
    piVar1 = (int *)((long)__s_00 + lVar13 * 4);
    *piVar1 = iVar11;
    piVar1[1] = iVar21;
    piVar1[2] = iVar22;
    piVar1[3] = iVar23;
    lVar13 = lVar13 + 4;
    iVar11 = iVar11 + 4;
    iVar21 = iVar21 + 4;
    iVar22 = iVar22 + 4;
    iVar23 = iVar23 + 4;
  } while (lVar13 != 0x48);
  uVar19 = 0x48;
  do {
    dVar12 = deRandom_getUint32((deRandom *)local_1b0);
    uVar5 = (ulong)dVar12 % (uVar19 & 0xffffffff);
    uVar2 = *(undefined4 *)((long)__s_00 + uVar19 * 4 + -4);
    *(undefined4 *)((long)__s_00 + uVar19 * 4 + -4) = *(undefined4 *)((long)__s_00 + uVar5 * 4);
    *(undefined4 *)((long)__s_00 + uVar5 * 4) = uVar2;
    auVar6 = _DAT_009a6100;
    uVar19 = uVar19 - 1;
  } while (1 < uVar19);
  lVar13 = 0;
  puVar17 = __s;
  do {
    auVar43 = *(undefined1 (*) [16])((long)__s_00 + lVar13 * 4);
    uVar29 = auVar43._0_4_;
    uVar32 = auVar43._4_4_;
    iVar11 = auVar43._12_4_;
    auVar40._4_4_ = uVar32;
    auVar40._0_4_ = uVar32;
    auVar40._8_4_ = iVar11;
    auVar40._12_4_ = iVar11;
    auVar25 = auVar43 & _DAT_0094efd0;
    uVar24 = -(uint)(auVar25._0_4_ == 0);
    uVar26 = -(uint)(auVar25._4_4_ == 0);
    uVar27 = -(uint)(auVar25._8_4_ == 0);
    uVar28 = -(uint)(auVar25._12_4_ == 0);
    auVar25._0_4_ = (int)uVar29 / 2;
    auVar25._4_4_ = (int)uVar32 / 2;
    auVar25._8_4_ = auVar43._8_4_ / 2;
    auVar25._12_4_ = iVar11 / 2;
    auVar49._4_4_ = auVar25._4_4_;
    auVar49._0_4_ = auVar25._4_4_;
    auVar49._8_4_ = auVar25._12_4_;
    auVar49._12_4_ = auVar25._12_4_;
    iVar21 = (int)((ulong)auVar25._0_4_ * 0x2aaaaaab >> 0x20) -
             (-(uint)((int)auVar25._0_4_ < 0) & 0x2aaaaaab);
    iVar22 = (int)((ulong)auVar25._4_4_ * 0x2aaaaaab >> 0x20) -
             (-(uint)((int)auVar25._4_4_ < 0) & 0x2aaaaaab);
    iVar23 = (int)((auVar25._8_8_ & 0xffffffff) * 0x2aaaaaab >> 0x20) -
             (-(uint)(auVar25._8_4_ < 0) & 0x2aaaaaab);
    iVar48 = (int)((auVar49._8_8_ & 0xffffffff) * 0x2aaaaaab >> 0x20) -
             (-(uint)(auVar25._12_4_ < 0) & 0x2aaaaaab);
    auVar50._0_4_ = iVar21 - (iVar21 >> 0x1f);
    auVar50._4_4_ = iVar22 - (iVar22 >> 0x1f);
    auVar50._8_4_ = iVar23 - (iVar23 >> 0x1f);
    auVar50._12_4_ = iVar48 - (iVar48 >> 0x1f);
    auVar47._4_4_ = auVar50._4_4_;
    auVar47._0_4_ = auVar50._4_4_;
    auVar47._8_4_ = auVar50._12_4_;
    auVar47._12_4_ = auVar50._12_4_;
    iVar48 = (int)((ulong)uVar29 * 0x2aaaaaab >> 0x20) - (-(uint)((int)uVar29 < 0) & 0x2aaaaaab);
    iVar36 = (int)((ulong)uVar32 * 0x2aaaaaab >> 0x20) - (-(uint)((int)uVar32 < 0) & 0x2aaaaaab);
    iVar37 = (int)((auVar43._8_8_ & 0xffffffff) * 0x2aaaaaab >> 0x20) -
             (-(uint)(auVar43._8_4_ < 0) & 0x2aaaaaab);
    iVar38 = (int)((auVar40._8_8_ & 0xffffffff) * 0x2aaaaaab >> 0x20) -
             (-(uint)(iVar11 < 0) & 0x2aaaaaab);
    iVar11 = auVar25._0_4_ + auVar50._0_4_ * -6;
    iVar21 = auVar25._4_4_ + auVar50._4_4_ * -6;
    iVar22 = auVar25._8_4_ - (int)((auVar50._8_8_ & 0xffffffff) * 6);
    iVar23 = auVar25._12_4_ - (int)((auVar47._8_8_ & 0xffffffff) * 6);
    iVar48 = (iVar48 >> 1) - (iVar48 >> 0x1f);
    iVar36 = (iVar36 >> 1) - (iVar36 >> 0x1f);
    iVar37 = (iVar37 >> 1) - (iVar37 >> 0x1f);
    iVar38 = (iVar38 >> 1) - (iVar38 >> 0x1f);
    auVar39._0_4_ = (float)iVar11;
    auVar39._4_4_ = (float)iVar21;
    auVar39._8_4_ = (float)iVar22;
    auVar39._12_4_ = (float)iVar23;
    auVar40 = divps(auVar39,auVar6);
    auVar42._0_4_ = (float)iVar48;
    auVar42._4_4_ = (float)iVar36;
    auVar42._8_4_ = (float)iVar37;
    auVar42._12_4_ = (float)iVar38;
    auVar43 = divps(auVar42,auVar6);
    fVar41 = auVar43._0_4_ + auVar43._0_4_ + -1.0;
    fVar44 = auVar43._4_4_ + auVar43._4_4_ + -1.0;
    fVar45 = auVar43._8_4_ + auVar43._8_4_ + -1.0;
    fVar46 = auVar43._12_4_ + auVar43._12_4_ + -1.0;
    *puVar17 = auVar40._0_4_;
    puVar17[1] = (uint)fVar41;
    auVar43._0_4_ = (float)(iVar11 + 1);
    auVar43._4_4_ = (float)(iVar21 + 1);
    auVar43._8_4_ = (float)(iVar22 + 1);
    auVar43._12_4_ = (float)(iVar23 + 1);
    puVar17[0xc] = auVar40._4_4_;
    puVar17[0xd] = (uint)fVar44;
    puVar17[0xe] = 0;
    puVar17[0xf] = 0x3f800000;
    auVar43 = divps(auVar43,auVar6);
    auVar31._0_4_ = (float)(iVar48 + 1);
    auVar31._4_4_ = (float)(iVar36 + 1);
    auVar31._8_4_ = (float)(iVar37 + 1);
    auVar31._12_4_ = (float)(iVar38 + 1);
    *(ulong *)(puVar17 + 0x18) = CONCAT44(fVar45,auVar40._8_4_);
    puVar17[0x1a] = 0;
    puVar17[0x1b] = 0x3f800000;
    auVar25 = divps(auVar31,auVar6);
    fVar30 = auVar25._0_4_ + auVar25._0_4_ + -1.0;
    fVar33 = auVar25._4_4_ + auVar25._4_4_ + -1.0;
    fVar34 = auVar25._8_4_ + auVar25._8_4_ + -1.0;
    fVar35 = auVar25._12_4_ + auVar25._12_4_ + -1.0;
    puVar17[0x24] = auVar40._12_4_;
    puVar17[0x25] = (uint)fVar46;
    puVar17[0x26] = 0;
    puVar17[0x27] = 0x3f800000;
    puVar17[2] = 0;
    puVar17[3] = 0x3f800000;
    puVar17[4] = auVar43._0_4_;
    puVar17[5] = (uint)fVar30 & uVar24 | ~uVar24 & (uint)fVar41;
    puVar17[0x10] = auVar43._4_4_;
    puVar17[0x11] = (uint)fVar33 & uVar26 | ~uVar26 & (uint)fVar44;
    puVar17[0x12] = 0;
    puVar17[0x13] = 0x3f800000;
    *(ulong *)(puVar17 + 0x1c) =
         CONCAT44((uint)fVar34 & uVar27 | ~uVar27 & (uint)fVar45,auVar43._8_4_);
    puVar17[0x1e] = 0;
    puVar17[0x1f] = 0x3f800000;
    puVar17[0x28] = auVar43._12_4_;
    puVar17[0x29] = (uint)fVar35 & uVar28 | ~uVar28 & (uint)fVar46;
    puVar17[0x2a] = 0;
    puVar17[0x2b] = 0x3f800000;
    puVar17[6] = 0;
    puVar17[7] = 0x3f800000;
    puVar17[8] = ~uVar24 & auVar43._0_4_ | auVar40._0_4_ & uVar24;
    puVar17[9] = (uint)fVar30;
    *(ulong *)(puVar17 + 0x14) = CONCAT44(fVar33,~uVar26 & auVar43._4_4_ | auVar40._4_4_ & uVar26);
    *(ulong *)(puVar17 + 0x20) = CONCAT44(fVar34,~uVar27 & auVar43._8_4_ | auVar40._8_4_ & uVar27);
    *(ulong *)(puVar17 + 0x2c) = CONCAT44(fVar35,~uVar28 & auVar43._12_4_ | auVar40._12_4_ & uVar28)
    ;
    puVar17[10] = 0;
    puVar17[0xb] = 0x3f800000;
    puVar17[0x16] = 0;
    puVar17[0x17] = 0x3f800000;
    puVar17[0x22] = 0;
    puVar17[0x23] = 0x3f800000;
    puVar17[0x2e] = 0;
    puVar17[0x2f] = 0x3f800000;
    lVar13 = lVar13 + 4;
    puVar17 = puVar17 + 0x30;
  } while (lVar13 != 0x48);
  this_03 = (ObjectWrapper *)operator_new(0x18);
  iVar11 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  traits = glu::objectTraits(OBJECTTYPE_BUFFER);
  glu::ObjectWrapper::ObjectWrapper(this_03,(Functions *)CONCAT44(extraout_var_00,iVar11),traits);
  local_370._0_8_ = (TypedObjectWrapper<(glu::ObjectType)1> *)0x0;
  this_00 = &this->m_vbo;
  if (&((this->m_vbo).
        super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
        .m_data.ptr)->super_ObjectWrapper != this_03) {
    de::details::
    UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
    ::reset(&this_00->
             super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
           );
    (this_00->
    super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
    ).m_data.ptr = (TypedObjectWrapper<(glu::ObjectType)1> *)this_03;
  }
  de::details::
  UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
  ::reset((UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
           *)local_370);
  (**(code **)(lVar18 + 0x40))
            (0x8892,(((this_00->
                      super_UniqueBase<glu::TypedObjectWrapper<(glu::ObjectType)1>,_de::DefaultDeleter<glu::TypedObjectWrapper<(glu::ObjectType)1>_>_>
                      ).m_data.ptr)->super_ObjectWrapper).m_object);
  (**(code **)(lVar18 + 0x150))(0x8892,0xd80,__s,0x88e4);
  dVar12 = (**(code **)(lVar18 + 0x800))();
  pcVar20 = (char *)0x12cd;
  glu::checkError(dVar12,"create vbo",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fPrimitiveBoundingBoxTests.cpp"
                  ,0x12cd);
  this->m_numVertices = 0xd8;
  operator_delete(__s_00,0x120);
  operator_delete(__s,0xd80);
  local_310.m_contextInfo = (ContextInfo *)operator_new(0xd0);
  pCVar3 = (this->super_TestCase).m_context;
  renderCtx = pCVar3->m_renderCtx;
  memset(local_1b0,0,0xac);
  local_100[0]._0_9_ = SUB169((undefined1  [16])0x0,0);
  local_100[0]._M_finish._1_7_ = 0;
  local_100._16_9_ = SUB169((undefined1  [16])0x0,7);
  local_320 = &local_310;
  local_348._0_8_ = (TestContext *)0x102;
  pCVar14 = (Context *)std::__cxx11::string::_M_create((ulong *)&local_320,(ulong)local_348);
  uVar7 = local_348._0_8_;
  local_310.m_testCtx = (TestContext *)local_348._0_8_;
  local_320 = pCVar14;
  memcpy(pCVar14,
         "${GLSL_VERSION_DECL}\nin highp vec4 a_position;\nout highp vec4 v_vertex_color;\nvoid main()\n{\n\tgl_Position = a_position;\n\t// yellowish shade\n\thighp float redComponent = 0.5 + float(gl_VertexID % 5) / 8.0;\n\tv_vertex_color = vec4(redComponent, 1.0, 0.0, 1.0);\n}\n"
         ,0x102);
  local_318 = (TestContext *)uVar7;
  *(char *)((long)&pCVar14->m_testCtx + uVar7) = '\0';
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_1e0,(_anonymous_namespace_ *)pCVar3,local_320,pcVar20);
  local_370._0_8_ = local_370._0_8_ & 0xffffffff00000000;
  local_370._8_8_ = local_360._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_370 + 8),local_1e0._M_dataplus._M_p,
             local_1e0._M_dataplus._M_p + local_1e0._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + (local_370._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_370 + 8));
  pCVar3 = (this->super_TestCase).m_context;
  local_2e8.m_contextInfo = (ContextInfo *)local_2c8;
  local_298 = (ContextInfo *)0x81;
  __dest = (ContextInfo *)
           std::__cxx11::string::_M_create((ulong *)&local_2e8.m_contextInfo,(ulong)&local_298);
  pCVar8 = local_298;
  local_2c8._0_8_ = local_298;
  local_2e8.m_contextInfo = __dest;
  memcpy(__dest,
         "${GLSL_VERSION_DECL}\nin mediump vec4 v_color;\nlayout(location = 0) out mediump vec4 o_color;\nvoid main()\n{\n\to_color = v_color;\n}\n"
         ,0x81);
  local_2d0 = pCVar8;
  *(undefined1 *)((long)&__dest->_vptr_ContextInfo + (long)pCVar8) = 0;
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_200,(_anonymous_namespace_ *)pCVar3,(Context *)local_2e8.m_contextInfo,pcVar20);
  local_348._0_4_ = 1;
  local_348._8_8_ = local_338._M_local_buf + 8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_348 + 8),local_200._M_dataplus._M_p,
             local_200._M_dataplus._M_p + local_200._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + (local_348._0_8_ & 0xffffffff) * 0x18),(value_type *)(local_348 + 8));
  pCVar3 = (this->super_TestCase).m_context;
  local_2f8 = &local_2e8;
  local_268 = (TestContext *)0x1a6;
  pCVar14 = (Context *)std::__cxx11::string::_M_create((ulong *)&local_2f8,(ulong)&local_268);
  pTVar9 = local_268;
  local_2e8.m_testCtx = local_268;
  local_2f8 = pCVar14;
  memcpy(pCVar14,
         "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\nlayout(vertices=3) out;\nin highp vec4 v_vertex_color[];\nout highp vec4 v_tess_eval_color[];\nvoid main()\n{\n\tgl_out[gl_InvocationID].gl_Position = gl_in[gl_InvocationID].gl_Position;\n\tv_tess_eval_color[gl_InvocationID] = v_vertex_color[gl_InvocationID];\n\tgl_TessLevelOuter[0] = 2.8;\n\tgl_TessLevelOuter[1] = 2.8;\n\tgl_TessLevelOuter[2] = 2.8;\n\tgl_TessLevelInner[0] = 2.8;\n}\n"
         ,0x1a6);
  local_2f0 = pTVar9;
  *(undefined1 *)((long)&pCVar14->m_testCtx + (long)pTVar9) = 0;
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_220,(_anonymous_namespace_ *)pCVar3,local_2f8,pcVar20);
  local_298 = (ContextInfo *)CONCAT44(local_298._4_4_,3);
  local_290._M_dataplus._M_p = (pointer)&local_290.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_290,local_220._M_dataplus._M_p,
             local_220._M_dataplus._M_p + local_220._M_string_length);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + ((ulong)local_298 & 0xffffffff) * 0x18),&local_290);
  pCVar3 = (this->super_TestCase).m_context;
  local_270 = (TestContext *)0x1f5;
  local_2c8._16_8_ = (pointer)(local_2c8 + 0x20);
  __dest_00 = (pointer)std::__cxx11::string::_M_create
                                 ((ulong *)(local_2c8 + 0x10),(ulong)&local_270);
  pTVar9 = local_270;
  local_2c8._32_8_ = local_270;
  local_2c8._16_8_ = __dest_00;
  memcpy(__dest_00,
         "${GLSL_VERSION_DECL}\n${TESSELLATION_SHADER_REQUIRE}\n${GPU_SHADER5_REQUIRE}\nlayout(triangles) in;\nin highp vec4 v_tess_eval_color[];\nout highp vec4 v_color;\nprecise gl_Position;\nvoid main()\n{\n\tgl_Position = gl_TessCoord.x * gl_in[0].gl_Position\n\t            + gl_TessCoord.y * gl_in[1].gl_Position\n\t            + gl_TessCoord.z * gl_in[2].gl_Position;\n\tv_color = gl_TessCoord.x * v_tess_eval_color[0]\n\t        + gl_TessCoord.y * v_tess_eval_color[1]\n\t        + gl_TessCoord.z * v_tess_eval_color[2];\n}\n"
         ,0x1f5);
  local_2c8._24_8_ = pTVar9;
  *(undefined1 *)((long)&(__dest_00->_M_dataplus)._M_p + (long)pTVar9) = 0;
  (anonymous_namespace)::specializeShader_abi_cxx11_
            (&local_240,(_anonymous_namespace_ *)pCVar3,(Context *)local_2c8._16_8_,pcVar20);
  local_268 = (TestContext *)CONCAT44(local_268._4_4_,4);
  local_260._M_dataplus._M_p = (pointer)&local_260.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_260,local_240._M_dataplus._M_p,
             local_240._M_dataplus._M_p + local_240._M_string_length);
  pCVar8 = local_310.m_contextInfo;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + ((ulong)local_268 & 0xffffffff) * 0x18),&local_260);
  glu::ShaderProgram::ShaderProgram((ShaderProgram *)pCVar8,renderCtx,(ProgramSources *)local_1b0);
  local_1c0.m_data.ptr = (ShaderProgram *)0x0;
  this_01 = &this->m_program;
  if ((this->m_program).
      super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>.m_data.ptr !=
      (ShaderProgram *)pCVar8) {
    de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
              (&this_01->
                super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>);
    (this_01->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).m_data.
    ptr = (ShaderProgram *)pCVar8;
  }
  de::details::UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>::reset
            (&local_1c0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_260._M_dataplus._M_p != &local_260.field_2) {
    operator_delete(local_260._M_dataplus._M_p,local_260.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_240._M_dataplus._M_p != &local_240.field_2) {
    operator_delete(local_240._M_dataplus._M_p,local_240.field_2._M_allocated_capacity + 1);
  }
  if ((pointer)local_2c8._16_8_ != (pointer)(local_2c8 + 0x20)) {
    operator_delete((void *)local_2c8._16_8_,(ulong)((long)(Platform **)local_2c8._32_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_290._M_dataplus._M_p != &local_290.field_2) {
    operator_delete(local_290._M_dataplus._M_p,local_290.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p,local_220.field_2._M_allocated_capacity + 1);
  }
  if (local_2f8 != &local_2e8) {
    operator_delete(local_2f8,(ulong)((long)&(local_2e8.m_testCtx)->m_platform + 1));
  }
  if ((char *)local_348._8_8_ != local_338._M_local_buf + 8) {
    operator_delete((void *)local_348._8_8_,
                    CONCAT17(local_338._M_local_buf[0xf],
                             CONCAT16(local_338._M_local_buf[0xe],local_338._8_6_)) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != &local_200.field_2) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  if (local_2e8.m_contextInfo != (ContextInfo *)local_2c8) {
    operator_delete(local_2e8.m_contextInfo,(ulong)((long)(_func_int ***)local_2c8._0_8_ + 1));
  }
  if ((char *)local_370._8_8_ != local_360._M_local_buf + 8) {
    operator_delete((void *)local_370._8_8_,local_360._8_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
    operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
  }
  if (local_320 != &local_310) {
    operator_delete(local_320,(ulong)((long)&(local_310.m_testCtx)->m_platform + 1));
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_100);
  std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
            (&local_120);
  lVar18 = 0x78;
  do {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)(local_1b0 + lVar18));
    lVar18 = lVar18 + -0x18;
  } while (lVar18 != -0x18);
  pTVar15 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  local_360._M_allocated_capacity._0_4_ = 0x676f7250;
  local_370._8_8_ = 7;
  local_360._M_allocated_capacity._4_4_ = 0x6d6172;
  local_338._M_allocated_capacity._0_6_ = 0x726564616853;
  local_338._M_allocated_capacity._6_2_ = 0x7020;
  local_338._8_6_ = 0x6d6172676f72;
  local_348._8_8_ = 0xe;
  local_338._M_local_buf[0xe] = '\0';
  local_370._0_8_ = &local_360;
  local_348._0_8_ = &local_338;
  tcu::LogSection::LogSection((LogSection *)local_1b0,(string *)local_370,(string *)local_348);
  tcu::TestLog::startSection(pTVar15,(char *)local_1b0._0_8_,(char *)local_1a0._16_8_);
  pTVar15 = glu::operator<<(pTVar15,(this_01->
                                    super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>
                                    ).m_data.ptr);
  tcu::TestLog::endSection(pTVar15);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._16_8_ != local_180) {
    operator_delete((void *)local_1a0._16_8_,(ulong)(local_180[0]._M_allocated_capacity + 1));
  }
  if ((pointer)local_1b0._0_8_ != (pointer)(local_1b0 + 0x10)) {
    operator_delete((void *)local_1b0._0_8_,(ulong)(local_1a0._0_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_348._0_8_ != &local_338) {
    operator_delete((void *)local_348._0_8_,
                    CONCAT26(local_338._M_allocated_capacity._6_2_,
                             local_338._M_allocated_capacity._0_6_) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_370._0_8_ != &local_360) {
    operator_delete((void *)local_370._0_8_,
                    CONCAT44(local_360._M_allocated_capacity._4_4_,
                             local_360._M_allocated_capacity._0_4_) + 1);
  }
  pSVar4 = (this_01->super_UniqueBase<glu::ShaderProgram,_de::DefaultDeleter<glu::ShaderProgram>_>).
           m_data.ptr;
  if ((pSVar4->m_program).m_info.linkOk != false) {
    return (int)pSVar4;
  }
  this_04 = (TestError *)__cxa_allocate_exception(0x38);
  local_1b0._0_8_ = (pointer)(local_1b0 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)local_1b0,"shader build failed","");
  tcu::TestError::TestError(this_04,(string *)local_1b0);
  __cxa_throw(this_04,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void ViewportCallOrderCase::init (void)
{
	const bool supportsES32 = glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::es(3, 2));

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_primitive_bounding_box"))
		throw tcu::NotSupportedError("Test requires GL_EXT_primitive_bounding_box extension");

	if (!supportsES32 && !m_context.getContextInfo().isExtensionSupported("GL_EXT_tessellation_shader"))
		throw tcu::NotSupportedError("Test requires GL_EXT_tessellation_shader extension");

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Testing call order of state setting functions have no effect on the rendering.\n"
		<< "Setting viewport and bounding box in the following order:\n"
			<< ((m_callOrder == VIEWPORT_FIRST)
				? ("\tFirst viewport with glViewport function.\n")
				: ("\tFirst bounding box with glPrimitiveBoundingBoxEXT function.\n"))
			<< ((m_callOrder == VIEWPORT_FIRST)
				? ("\tThen bounding box with glPrimitiveBoundingBoxEXT function.\n")
				: ("\tThen viewport with glViewport function.\n"))
		<< "Verifying rendering result."
		<< tcu::TestLog::EndMessage;

	// resources
	genVbo();
	genProgram();
}